

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamahaCommands.hpp
# Opt level: O3

void __thiscall TI::TMS::Commands::Line::advance(Line *this)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  CommandContext *pCVar4;
  Vector *pVVar5;
  int iVar6;
  uint uVar7;
  
  pCVar4 = (this->super_Command).context;
  (pCVar4->size).v[0] = (pCVar4->size).v[0] + -1;
  (this->super_Command).cycles = 0x58;
  bVar2 = pCVar4->arguments;
  if ((bVar2 & 1) == 0) {
    pVVar5 = &pCVar4->destination;
    uVar7 = 0x1ff;
    iVar6 = 1;
    if ((bVar2 & 4) != 0) {
      iVar6 = 0x1ff;
    }
  }
  else {
    uVar7 = 0x3ff;
    iVar6 = 1;
    if ((bVar2 & 8) != 0) {
      iVar6 = 0x3ff;
    }
    pVVar5 = (Vector *)((pCVar4->destination).v + 1);
  }
  pVVar5->v[0] = iVar6 + pVVar5->v[0] & uVar7;
  iVar6 = this->position_ - this->numerator_;
  this->position_ = iVar6;
  if (iVar6 < 0) {
    iVar3 = this->denominator_;
    piVar1 = &(this->super_Command).cycles;
    *piVar1 = *piVar1 + 0x20;
    this->position_ = iVar6 + iVar3;
    if ((bVar2 & 1) == 0) {
      uVar7 = 0x3ff;
      iVar6 = 1;
      if ((bVar2 & 8) != 0) {
        iVar6 = 0x3ff;
      }
      pVVar5 = (Vector *)((pCVar4->destination).v + 1);
    }
    else {
      pVVar5 = &pCVar4->destination;
      uVar7 = 0x1ff;
      iVar6 = 1;
      if ((bVar2 & 4) != 0) {
        iVar6 = 0x1ff;
      }
    }
    pVVar5->v[0] = iVar6 + pVVar5->v[0] & uVar7;
    return;
  }
  return;
}

Assistant:

void advance() final {
			--context.size.v[0];
			cycles = 88;

			// b0:	1 => long direction is y;
			//		0 => long direction is x.
			//
			// b2:	1 => x direction is left;
			//		0 => x direction is right.
			//
			// b3:	1 => y direction is up;
			//		0 => y direction is down.
			if(context.arguments & 0x1) {
				advance_axis<1, false>();
			} else {
				advance_axis<0, false>();
			}

			position_ -= numerator_;
			if(position_ < 0) {
				position_ += denominator_;
				cycles += 32;

				if(context.arguments & 0x1) {
					advance_axis<0, false>();
				} else {
					advance_axis<1, false>();
				}
			}
		}